

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

int jsondec_epochdays(int y,int m,int d)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = m + 9;
  if (2 < (uint)m) {
    iVar1 = m + -3;
  }
  uVar2 = (y - (uint)((uint)m < 3)) + 0x12c0;
  return uVar2 / 400 + (uVar2 >> 2) + (d - uVar2 / 100) + uVar2 * 0x16d +
         (iVar1 * 0xf4ff + 0x301U >> 0xb) + -0x25bab9;
}

Assistant:

int jsondec_epochdays(int y, int m, int d) {
  const uint32_t year_base = 4800; /* Before min year, multiple of 400. */
  const uint32_t m_adj = m - 3;    /* March-based month. */
  const uint32_t carry = m_adj > (uint32_t)m ? 1 : 0;
  const uint32_t adjust = carry ? 12 : 0;
  const uint32_t y_adj = y + year_base - carry;
  const uint32_t month_days = ((m_adj + adjust) * 62719 + 769) / 2048;
  const uint32_t leap_days = y_adj / 4 - y_adj / 100 + y_adj / 400;
  return y_adj * 365 + leap_days + month_days + (d - 1) - 2472632;
}